

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O3

bool parse_large_integer(uint8_t *buf,ParsedJson *pj,uint32_t offset,bool found_minus)

{
  uint uVar1;
  uint64_t *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  byte *pbVar6;
  byte bVar7;
  ulong uVar8;
  
  uVar8 = (ulong)offset;
  uVar4 = CONCAT71(in_register_00000009,found_minus) & 0xffffffff;
  if (buf[uVar4 + uVar8] != '0') {
    uVar5 = (ulong)(byte)(buf[uVar4 + uVar8] - 0x30);
    pbVar6 = buf + uVar4 + uVar8;
    while( true ) {
      pbVar6 = pbVar6 + 1;
      bVar7 = *pbVar6 - 0x30;
      if (9 < bVar7) break;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar5;
      uVar4 = SUB168(auVar3 * ZEXT816(10),0);
      if (SUB168(auVar3 * ZEXT816(10),8) != 0) {
        return false;
      }
      uVar5 = uVar4 + bVar7;
      if (CARRY8(uVar4,(ulong)bVar7)) {
        return false;
      }
    }
    if (found_minus) {
      if (uVar5 < 0x8000000000000001) goto LAB_0010885d;
    }
    else if (-1 < (long)uVar5) goto LAB_0010885d;
    return false;
  }
  pbVar6 = buf + uVar4 + uVar8 + 1;
  uVar5 = 0;
LAB_0010885d:
  uVar4 = -uVar5;
  if (!found_minus) {
    uVar4 = uVar5;
  }
  puVar2 = pj->tape;
  uVar1 = pj->current_loc;
  puVar2[uVar1] = 0x6c00000000000000;
  pj->current_loc = uVar1 + 2;
  puVar2[uVar1 + 1] = uVar4;
  return structural_or_whitespace[*pbVar6] != 0;
}

Assistant:

static never_inline bool parse_large_integer(const uint8_t *const buf,
                                             ParsedJson &pj,
                                             const uint32_t offset,
                                             bool found_minus) {
  const char *p = reinterpret_cast<const char *>(buf + offset);

  bool negative = false;
  if (found_minus) {
    ++p;
    negative = true;
  }
  uint64_t i;
  if (*p == '0') { // 0 cannot be followed by an integer
    ++p;
    i = 0;
  } else {
    unsigned char digit = *p - '0';
    i = digit;
    p++;
    // the is_made_of_eight_digits_fast routine is unlikely to help here because
    // we rarely see large integer parts like 123456789
    while (is_integer(*p)) {
      digit = *p - '0';
      if (mul_overflow(i, 10, &i)) {
#ifdef JSON_TEST_NUMBERS // for unit testing
        foundInvalidNumber(buf + offset);
#endif
        return false; // overflow
      }
      if (add_overflow(i, digit, &i)) {
#ifdef JSON_TEST_NUMBERS // for unit testing
        foundInvalidNumber(buf + offset);
#endif
        return false; // overflow
      }
      ++p;
    }
  }
  if (negative) {
    if (i > 0x8000000000000000) {
// overflows!
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false; // overflow
    }
  } else {
    if (i >= 0x8000000000000000) {
// overflows!
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false; // overflow
    }
  }
  int64_t signed_answer = negative ? -i : i;
  pj.write_tape_s64(signed_answer);
#ifdef JSON_TEST_NUMBERS // for unit testing
  foundInteger(signed_answer, buf + offset);
#endif
  return is_structural_or_whitespace(*p);
}